

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O2

void VP8LHistogramCreate(VP8LHistogram *h,VP8LBackwardRefs *refs,int palette_code_bits)

{
  if (-1 < palette_code_bits) {
    h->palette_code_bits = palette_code_bits;
  }
  HistogramClear(h);
  VP8LHistogramStoreRefs(refs,(_func_int_int_int *)0x0,0,h);
  return;
}

Assistant:

void VP8LHistogramCreate(VP8LHistogram* const h,
                         const VP8LBackwardRefs* const refs,
                         int palette_code_bits) {
  if (palette_code_bits >= 0) {
    h->palette_code_bits = palette_code_bits;
  }
  HistogramClear(h);
  VP8LHistogramStoreRefs(refs, /*distance_modifier=*/NULL,
                         /*distance_modifier_arg0=*/0, h);
}